

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O2

bool __thiscall
psy::C::InternalsTestSuite::checkErrorAndWarn(InternalsTestSuite *this,Expectation *X)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  string *id;
  value_type *pvVar5;
  size_type sVar6;
  ostream *poVar7;
  undefined8 uVar8;
  ostream *this_00;
  int iVar9;
  char *pcVar10;
  __node_base *p_Var11;
  int iVar12;
  pointer pbVar13;
  Diagnostic *diagnostic;
  _Alloc_hider _Var14;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  W_IDs;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  E_IDs;
  
  E_IDs._M_h._M_buckets = &E_IDs._M_h._M_single_bucket;
  E_IDs._M_h._M_bucket_count = 1;
  E_IDs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  E_IDs._M_h._M_element_count = 0;
  E_IDs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  E_IDs._M_h._M_rehash_policy._M_next_resize = 0;
  E_IDs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  W_IDs._M_h._M_buckets = &W_IDs._M_h._M_single_bucket;
  W_IDs._M_h._M_bucket_count = 1;
  W_IDs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  W_IDs._M_h._M_element_count = 0;
  W_IDs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  W_IDs._M_h._M_rehash_policy._M_next_resize = 0;
  W_IDs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SyntaxTree::diagnostics
            ((vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *)&msg,
             (this->tree_)._M_t.
             super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>.
             _M_t.
             super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
             super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl);
  p_Var11 = &W_IDs._M_h._M_before_begin;
  iVar9 = 0;
  iVar12 = 0;
  _Var14 = msg._M_dataplus;
  do {
    if (_Var14._M_p == (pointer)msg._M_string_length) {
      std::vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_>::~vector
                ((vector<psy::Diagnostic,_std::allocator<psy::Diagnostic>_> *)&msg);
      if ((X->numW_ != iVar9) || (iVar4 = iVar9, X->numE_ != iVar12)) {
        std::operator<<((ostream *)&std::cout,"mismatch in ");
        pcVar10 = "WARNING";
        if (X->numW_ == iVar9) {
          pcVar10 = "ERROR";
        }
        std::operator<<((ostream *)&std::cout,pcVar10);
        std::operator<<((ostream *)&std::cout," count");
        iVar4 = X->numW_;
      }
      if (iVar9 == iVar4) {
        if (iVar12 == X->numE_) {
          pbVar13 = (X->descriptorsW_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (X->descriptorsW_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pbVar13 == pbVar1) {
              pbVar13 = (X->descriptorsE_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pbVar1 = (X->descriptorsE_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              while( true ) {
                if (pbVar13 == pbVar1) {
                  if ((X->numE_ == 0) || (X->continueTestDespiteOfErrors_ == true)) {
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable(&W_IDs._M_h);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable(&E_IDs._M_h);
                  return bVar2;
                }
                sVar6 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::count(&E_IDs._M_h,pbVar13);
                if (sVar6 == 0) break;
                pbVar13 = pbVar13 + 1;
              }
              std::operator+(&local_c0,"ERROR ",pbVar13);
              std::operator+(&msg,&local_c0," not found, got:");
              std::__cxx11::string::~string((string *)&local_c0);
              p_Var11 = &E_IDs._M_h._M_before_begin;
              while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
                std::operator+(&local_c0,"\n\t\t- ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (p_Var11 + 1));
                std::__cxx11::string::append((string *)&msg);
                std::__cxx11::string::~string((string *)&local_c0);
              }
              poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
              poVar7 = std::operator<<(poVar7,"\tReason: ");
              poVar7 = std::operator<<(poVar7,(string *)&msg);
              poVar7 = std::operator<<(poVar7,"\n");
              poVar7 = std::operator<<(poVar7,"\t\t");
              poVar7 = std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xaf);
              std::endl<char,std::char_traits<char>>(poVar7);
              uVar8 = __cxa_allocate_exception(1);
              __cxa_throw(uVar8,&TestFailed::typeinfo,0);
            }
            sVar6 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count(&W_IDs._M_h,pbVar13);
            if (sVar6 == 0) break;
            pbVar13 = pbVar13 + 1;
          }
          std::operator+(&local_c0,"WARNING ",pbVar13);
          std::operator+(&msg,&local_c0," not found, got:");
          std::__cxx11::string::~string((string *)&local_c0);
          while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
            std::operator+(&local_c0,"\n\t\t- ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var11 + 1));
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::~string((string *)&local_c0);
          }
          poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar7 = std::operator<<(poVar7,"\tReason: ");
          poVar7 = std::operator<<(poVar7,(string *)&msg);
          poVar7 = std::operator<<(poVar7,"\n");
          poVar7 = std::operator<<(poVar7,"\t\t");
          poVar7 = std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa6);
          std::endl<char,std::char_traits<char>>(poVar7);
          uVar8 = __cxa_allocate_exception(1);
          __cxa_throw(uVar8,&TestFailed::typeinfo,0);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar12);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,X->numE_);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        this_00 = (ostream *)std::operator<<(poVar7,":");
        iVar9 = 0x9f;
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar7 = std::operator<<(poVar7,"\t\tActual  : ");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar9);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\tExpected: ");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,X->numW_);
        poVar7 = std::operator<<(poVar7,"\n");
        poVar7 = std::operator<<(poVar7,"\t\t");
        poVar7 = std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        this_00 = (ostream *)std::operator<<(poVar7,":");
        iVar9 = 0x9e;
      }
      poVar7 = (ostream *)std::ostream::operator<<(this_00,iVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = __cxa_allocate_exception(1);
      __cxa_throw(uVar8,&TestFailed::typeinfo,0);
    }
    if (X->containsAmbiguity_ == true) {
      id = (string *)psy::DiagnosticDescriptor::id_abi_cxx11_();
      bVar2 = isDiagnosticDescriptorIdOfSyntaxAmbiguity(id);
      if (!bVar2) goto LAB_003990ff;
    }
    else {
LAB_003990ff:
      cVar3 = psy::Diagnostic::severity();
      if (cVar3 == '\x02') {
        pvVar5 = (value_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
        std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&E_IDs,pvVar5);
        iVar12 = iVar12 + 1;
      }
      else {
        cVar3 = psy::Diagnostic::severity();
        if (cVar3 == '\x01') {
          pvVar5 = (value_type *)psy::DiagnosticDescriptor::id_abi_cxx11_();
          std::__detail::
          _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&W_IDs,pvVar5);
          iVar9 = iVar9 + 1;
        }
      }
    }
    _Var14._M_p = _Var14._M_p + 0xc0;
  } while( true );
}

Assistant:

bool InternalsTestSuite::checkErrorAndWarn(Expectation X)
{
    int E_cnt = 0;
    int W_cnt = 0;
    std::unordered_set<std::string> E_IDs;
    std::unordered_set<std::string> W_IDs;
    for (const auto& diagnostic : tree_->diagnostics()) {
        if (X.containsAmbiguity_
                && isDiagnosticDescriptorIdOfSyntaxAmbiguity(diagnostic.descriptor().id()))
            continue;

        if (diagnostic.severity() == DiagnosticSeverity::Error) {
            ++E_cnt;
            E_IDs.insert(diagnostic.descriptor().id());
        }
        else if (diagnostic.severity() == DiagnosticSeverity::Warning) {
            ++W_cnt;
            W_IDs.insert(diagnostic.descriptor().id());
        }
    }

#ifdef DBG_DIAGNOSTICS
    if (!tree_->diagnostics().empty()) {
        for (auto& diagnostic : tree_->diagnostics()) {
            diagnostic.outputIndent_ = 2;
            std::cout << std::endl << diagnostic << std::endl;
        }
        std::cout << "\t";
    }
#endif

    if (X.numW_ != W_cnt || X.numE_ != E_cnt) {
#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%') << "\n\t";
#endif
        std::cout << "mismatch in ";
        if (X.numW_ != W_cnt)
            std::cout << "WARNING";
        else
            std::cout << "ERROR";
        std::cout << " count";

#ifdef DBG_DIAGNOSTICS
        std::cout << "\n\t" << std::string(25, '%');
#endif
    }

    PSY_EXPECT_EQ_INT(W_cnt, X.numW_);
    PSY_EXPECT_EQ_INT(E_cnt, X.numE_);

    for (const auto& id : X.descriptorsW_) {
        if (!W_IDs.count(id)) {
            std::string msg = "WARNING " + id + " not found, got:";
            for (const auto& idP : W_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    for (const auto& id : X.descriptorsE_) {
        if (!E_IDs.count(id)) {
            std::string msg = "ERROR " + id + " not found, got:";
            for (const auto& idP : E_IDs)
                msg += "\n\t\t- " + idP;
            PSY__internals__FAIL(msg);
        }
    }

    if (X.numE_ && !X.continueTestDespiteOfErrors_)
        return false;

    return true;
}